

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::PrecalculateTileInfo
               (vector<int,_std::allocator<int>_> *num_x_tiles,
               vector<int,_std::allocator<int>_> *num_y_tiles,EXRHeader *exr_header)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int min_x;
  int min_y;
  int iVar11;
  int max_x;
  int iVar12;
  
  iVar1 = (exr_header->data_window).min_x;
  iVar2 = (exr_header->data_window).min_y;
  iVar3 = (exr_header->data_window).max_x;
  iVar4 = (exr_header->data_window).max_y;
  iVar9 = exr_header->tile_level_mode;
  iVar12 = 1;
  if (iVar9 == 0) {
    iVar7 = 1;
    goto LAB_001c92e4;
  }
  if (iVar9 == 2) {
    uVar8 = (iVar3 - iVar1) + 1;
    if (exr_header->tile_rounding_mode == 0) {
      if (uVar8 < 2) goto LAB_001c91f6;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + 1;
        bVar5 = 3 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar5);
    }
    else if (uVar8 < 2) {
LAB_001c91f6:
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      iVar11 = 0;
      do {
        if ((uVar8 & 1) != 0) {
          iVar7 = 1;
        }
        iVar11 = iVar11 + 1;
        bVar5 = 3 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar5);
LAB_001c91b0:
      iVar7 = iVar7 + iVar11;
    }
LAB_001c91f8:
    iVar7 = iVar7 + 1;
  }
  else {
    iVar7 = 0;
    if (iVar9 == 1) {
      uVar6 = (iVar3 - iVar1) + 1;
      uVar8 = (iVar4 - iVar2) + 1;
      if ((int)uVar8 < (int)uVar6) {
        uVar8 = uVar6;
      }
      if (exr_header->tile_rounding_mode == 0) {
        if (1 < uVar8) {
          iVar7 = 0;
          uVar10 = (ulong)uVar8;
          do {
            iVar7 = iVar7 + 1;
            uVar8 = (uint)uVar10;
            uVar10 = uVar10 >> 1;
          } while (3 < uVar8);
          goto LAB_001c91f8;
        }
      }
      else if (1 < uVar8) {
        iVar7 = 0;
        iVar11 = 0;
        uVar10 = (ulong)uVar8;
        do {
          if ((uVar10 & 1) != 0) {
            iVar7 = 1;
          }
          iVar11 = iVar11 + 1;
          uVar8 = (uint)uVar10;
          uVar10 = uVar10 >> 1;
        } while (3 < uVar8);
        goto LAB_001c91b0;
      }
      goto LAB_001c91f6;
    }
  }
  if (iVar9 == 2) {
    uVar8 = (iVar4 - iVar2) + 1;
    if (exr_header->tile_rounding_mode == 0) {
      if (uVar8 < 2) goto LAB_001c92d9;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + 1;
        bVar5 = 3 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar5);
    }
    else {
      if (uVar8 < 2) goto LAB_001c92d9;
      iVar12 = 0;
      iVar9 = 0;
      do {
        if ((uVar8 & 1) != 0) {
          iVar12 = 1;
        }
        iVar9 = iVar9 + 1;
        bVar5 = 3 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar5);
LAB_001c9295:
      iVar12 = iVar12 + iVar9;
    }
  }
  else {
    if (iVar9 != 1) {
      if (iVar9 != 0) {
        iVar12 = 0;
      }
      goto LAB_001c92e4;
    }
    uVar6 = (iVar3 - iVar1) + 1;
    uVar8 = (iVar4 - iVar2) + 1;
    if ((int)uVar8 < (int)uVar6) {
      uVar8 = uVar6;
    }
    if (exr_header->tile_rounding_mode == 0) {
      if (1 < uVar8) {
        iVar12 = 0;
        uVar10 = (ulong)uVar8;
        do {
          iVar12 = iVar12 + 1;
          uVar8 = (uint)uVar10;
          uVar10 = uVar10 >> 1;
        } while (3 < uVar8);
        goto LAB_001c92e1;
      }
    }
    else if (1 < uVar8) {
      iVar12 = 0;
      iVar9 = 0;
      uVar10 = (ulong)uVar8;
      do {
        if ((uVar10 & 1) != 0) {
          iVar12 = 1;
        }
        iVar9 = iVar9 + 1;
        uVar8 = (uint)uVar10;
        uVar10 = uVar10 >> 1;
      } while (3 < uVar8);
      goto LAB_001c9295;
    }
LAB_001c92d9:
    iVar12 = 0;
  }
LAB_001c92e1:
  iVar12 = iVar12 + 1;
LAB_001c92e4:
  std::vector<int,_std::allocator<int>_>::resize(num_x_tiles,(long)iVar7);
  std::vector<int,_std::allocator<int>_>::resize(num_y_tiles,(long)iVar12);
  CalculateNumTiles(num_x_tiles,(iVar3 - iVar1) + 1,exr_header->tile_size_x,
                    exr_header->tile_rounding_mode);
  CalculateNumTiles(num_y_tiles,(iVar4 - iVar2) + 1,exr_header->tile_size_y,
                    exr_header->tile_rounding_mode);
  return;
}

Assistant:

static void PrecalculateTileInfo(std::vector<int>& num_x_tiles,
  std::vector<int>& num_y_tiles,
  const EXRHeader* exr_header) {
  int min_x = exr_header->data_window.min_x;
  int max_x = exr_header->data_window.max_x;
  int min_y = exr_header->data_window.min_y;
  int max_y = exr_header->data_window.max_y;

  int num_x_levels = CalculateNumXLevels(exr_header);
  int num_y_levels = CalculateNumYLevels(exr_header);

  num_x_tiles.resize(size_t(num_x_levels));
  num_y_tiles.resize(size_t(num_y_levels));

  CalculateNumTiles(num_x_tiles,
    max_x - min_x + 1,
    exr_header->tile_size_x,
    exr_header->tile_rounding_mode);

  CalculateNumTiles(num_y_tiles,
    max_y - min_y + 1,
    exr_header->tile_size_y,
    exr_header->tile_rounding_mode);
}